

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O3

UChar * __thiscall
icu_63::Normalizer2Impl::decomposeShort
          (Normalizer2Impl *this,UChar *src,UChar *limit,UBool stopAtCompBoundary,
          UBool onlyContiguous,ReorderingBuffer *buffer,UErrorCode *errorCode)

{
  ushort norm16;
  UBool UVar1;
  UChar UVar2;
  int iVar3;
  UCPTrie *trie;
  uint c;
  UChar *pUVar4;
  bool bVar5;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((src < limit) &&
       ((UVar2 = *src, stopAtCompBoundary == '\0' ||
        ((ushort)this->minCompNoMaybeCP <= (ushort)UVar2)))) {
      do {
        pUVar4 = src + 1;
        c = (uint)(ushort)UVar2;
        if ((c & 0xf800) == 0xd800) {
          if ((pUVar4 == limit || ((byte)((ushort)UVar2 >> 10) & 1) != 0) ||
             (UVar2 = *pUVar4, ((ushort)UVar2 & 0xfc00) != 0xdc00)) {
            trie = this->normTrie;
            iVar3 = trie->dataLength + -1;
          }
          else {
            pUVar4 = src + 2;
            c = c * 0x400 + (uint)(ushort)UVar2 + 0xfca02400;
            trie = this->normTrie;
            if ((int)c < trie->highStart) {
              iVar3 = ucptrie_internalSmallIndex_63(trie,c);
              trie = this->normTrie;
            }
            else {
              iVar3 = trie->dataLength + -2;
            }
          }
        }
        else {
          trie = this->normTrie;
          iVar3 = (c & 0x3f) + (uint)trie->index[(ushort)UVar2 >> 6];
        }
        norm16 = *(ushort *)((long)(trie->data).ptr0 + (long)iVar3 * 2);
        if (stopAtCompBoundary == '\0') {
          UVar1 = decompose(this,c,norm16,buffer,errorCode);
          if (UVar1 == '\0') goto LAB_002a5b5c;
        }
        else {
          if (norm16 < this->minNoNoCompNoMaybeCC) {
            return src;
          }
          if ((this->limitNoNo <= norm16) && (norm16 < this->minMaybeYes)) {
            return src;
          }
          UVar1 = decompose(this,c,norm16,buffer,errorCode);
          if (UVar1 == '\0') goto LAB_002a5b5c;
          if ((norm16 & 1) != 0) {
            if (onlyContiguous == '\0') {
              return pUVar4;
            }
            if (norm16 == 1) {
              return pUVar4;
            }
            if (norm16 < this->limitNoNo) {
              bVar5 = *(ushort *)((long)this->extraData + (ulong)(norm16 & 0xfffffffe)) < 0x200;
            }
            else {
              bVar5 = (norm16 & 6) < 3;
            }
            if (bVar5) {
              return pUVar4;
            }
          }
        }
        if (limit <= pUVar4) {
          return pUVar4;
        }
        UVar2 = *pUVar4;
        src = pUVar4;
        if ((stopAtCompBoundary != '\0') && ((ushort)UVar2 < (ushort)this->minCompNoMaybeCP)) {
          return pUVar4;
        }
      } while( true );
    }
  }
  else {
LAB_002a5b5c:
    src = (UChar *)0x0;
  }
  return src;
}

Assistant:

const UChar *
Normalizer2Impl::decomposeShort(const UChar *src, const UChar *limit,
                                UBool stopAtCompBoundary, UBool onlyContiguous,
                                ReorderingBuffer &buffer, UErrorCode &errorCode) const {
    if (U_FAILURE(errorCode)) {
        return nullptr;
    }
    while(src<limit) {
        if (stopAtCompBoundary && *src < minCompNoMaybeCP) {
            return src;
        }
        const UChar *prevSrc = src;
        UChar32 c;
        uint16_t norm16;
        UCPTRIE_FAST_U16_NEXT(normTrie, UCPTRIE_16, src, limit, c, norm16);
        if (stopAtCompBoundary && norm16HasCompBoundaryBefore(norm16)) {
            return prevSrc;
        }
        if(!decompose(c, norm16, buffer, errorCode)) {
            return nullptr;
        }
        if (stopAtCompBoundary && norm16HasCompBoundaryAfter(norm16, onlyContiguous)) {
            return src;
        }
    }
    return src;
}